

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O0

void __thiscall Args::CmdLine::parse(CmdLine *this,int argc,char **argv)

{
  char **unaff_retaddr;
  int in_stack_0000000c;
  CmdLine *in_stack_000003c0;
  ContextInternal *items;
  Context *in_stack_ffffffffffffffc0;
  ContextInternal local_30 [2];
  
  items = local_30;
  details::makeContext_abi_cxx11_(in_stack_0000000c,unaff_retaddr);
  Context::operator=(in_stack_ffffffffffffffc0,items);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&in_stack_ffffffffffffffc0->m_context);
  parse(in_stack_000003c0);
  return;
}

Assistant:

void parse( int argc, const char * const * argv )
#endif
	{
		m_context = std::move( details::makeContext( argc, argv ) );

		parse();
	}